

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadData
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pData,
          size_t a_uDataLen)

{
  ulong __n;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  SI_Error SVar4;
  char *__s;
  char *pComment;
  char *pVal;
  char *pItem;
  char *pSection;
  ulong local_40;
  char *pWork;
  
  if (a_uDataLen == 0) {
    return SI_OK;
  }
  if (((a_uDataLen < 3) || (this->m_bStoreIsUtf8 == false)) ||
     (iVar3 = bcmp(a_pData,anon_var_dwarf_f1fd,3), iVar3 != 0)) {
    if (a_uDataLen == 0xffffffffffffffff) {
      return SI_FAIL;
    }
  }
  else {
    a_pData = a_pData + 3;
    a_uDataLen = a_uDataLen - 3;
  }
  __n = a_uDataLen + 1;
  __s = (char *)operator_new__(__n);
  memset(__s,0,__n);
  memcpy(__s,a_pData,a_uDataLen);
  pItem = (char *)0x0;
  pVal = (char *)0x0;
  pSection = "";
  pComment = (char *)0x0;
  pcVar1 = this->m_pData;
  pWork = __s;
  SVar4 = FindFileComment(this,&pWork,pcVar1 != (char *)0x0);
  if (SI_FAIL < SVar4) {
    local_40 = __n;
    do {
      bVar2 = FindEntry(this,&pWork,&pSection,&pItem,&pVal,&pComment);
      if (!bVar2) {
        if (pcVar1 == (char *)0x0) {
          this->m_pData = __s;
          this->m_uDataLen = local_40;
        }
        else {
          operator_delete__(__s);
        }
        return SI_OK;
      }
      SVar4 = AddEntry(this,pSection,pItem,pVal,pComment,false,pcVar1 != (char *)0x0);
    } while (SI_FAIL < SVar4);
  }
  return SVar4;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::LoadData(const char *a_pData, size_t a_uDataLen) {
	SI_CONVERTER converter(m_bStoreIsUtf8);

	if (a_uDataLen == 0) {
		return SI_OK;
	}

	// consume the UTF-8 BOM if it exists
	if (m_bStoreIsUtf8 && a_uDataLen >= 3) {
		if (memcmp(a_pData, SI_UTF8_SIGNATURE, 3) == 0) {
			a_pData += 3;
			a_uDataLen -= 3;
		}
	}

	// determine the length of the converted data
	size_t uLen = converter.SizeFromStore(a_pData, a_uDataLen);
	if (uLen == (size_t)(-1)) {
		return SI_FAIL;
	}

	// allocate memory for the data, ensure that there is a NULL
	// terminator wherever the converted data ends
	SI_CHAR *pData = new SI_CHAR[uLen + 1];
	if (!pData) {
		return SI_NOMEM;
	}
	memset(pData, 0, sizeof(SI_CHAR) * (uLen + 1));

	// convert the data
	if (!converter.ConvertFromStore(a_pData, a_uDataLen, pData, uLen)) {
		delete[] pData;
		return SI_FAIL;
	}

	// parse it
	const static SI_CHAR empty = 0;
	SI_CHAR *pWork = pData;
	const SI_CHAR *pSection = &empty;
	const SI_CHAR *pItem = NULL;
	const SI_CHAR *pVal = NULL;
	const SI_CHAR *pComment = NULL;

	// We copy the strings if we are loading data into this class when we
	// already have stored some.
	bool bCopyStrings = (m_pData != NULL);

	// find a file comment if it exists, this is a comment that starts at the
	// beginning of the file and continues until the first blank line.
	SI_Error rc = FindFileComment(pWork, bCopyStrings);
	if (rc < 0) return rc;

	// add every entry in the file to the data table
	while (FindEntry(pWork, pSection, pItem, pVal, pComment)) {
		rc = AddEntry(pSection, pItem, pVal, pComment, false, bCopyStrings);
		if (rc < 0) return rc;
	}

	// store these strings if we didn't copy them
	if (bCopyStrings) {
		delete[] pData;
	} else {
		m_pData = pData;
		m_uDataLen = uLen + 1;
	}

	return SI_OK;
}